

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O2

void basisu::mul_image(imagef *src1,imagef *src2,imagef *dst,vec4F *scale)

{
  vec4F *pvVar1;
  vec4F *this;
  float *pfVar2;
  uint32_t c;
  uint32_t i;
  uint32_t y;
  uint32_t x;
  uint x_00;
  float fVar3;
  float fVar4;
  float fVar5;
  vec4F d;
  
  d.m_v[0] = 0.0;
  d.m_v[1] = 0.0;
  d.m_v[2] = 0.0;
  d.m_v[3] = 1.0;
  imagef::resize(dst,src1,0xffffffff,&d);
  for (y = 0; (int)y < (int)dst->m_height; y = y + 1) {
    for (x_00 = 0; x_00 < dst->m_width; x_00 = x_00 + 1) {
      pvVar1 = imagef::operator()(src1,x_00,y);
      this = imagef::operator()(src2,x_00,y);
      for (i = 0; i != 4; i = i + 1) {
        fVar3 = vec<4U,_float>::operator[](pvVar1,i);
        fVar4 = vec<4U,_float>::operator[](this,i);
        fVar5 = vec<4U,_float>::operator[](scale,i);
        pfVar2 = vec<4U,_float>::operator[](&d,i);
        *pfVar2 = fVar5 * fVar4 * fVar3;
      }
      pvVar1 = imagef::operator()(dst,x_00,y);
      vec<4U,_float>::operator=(pvVar1,&d);
    }
  }
  return;
}

Assistant:

void mul_image(const imagef &src1, const imagef &src2, imagef &dst, const vec4F &scale)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				vec4F d;

				for (uint32_t c = 0; c < 4; c++)
				{
					float v1 = s1[c];
					float v2 = s2[c];
					d[c] = v1 * v2 * scale[c];
				}

				dst(x, y) = d;
			}
		}
	}